

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitReturnStatement(SyntaxDumper *this,ReturnStatementSyntax *node)

{
  ExpressionSyntax *pEVar1;
  ReturnStatementSyntax local_98 [72];
  ReturnStatementSyntax local_50 [56];
  ReturnStatementSyntax *local_18;
  ReturnStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ReturnStatementSyntax *)this;
  ReturnStatementSyntax::returnKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  pEVar1 = ReturnStatementSyntax::expression(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  ReturnStatementSyntax::semicolonToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  return Skip;
}

Assistant:

virtual Action visitReturnStatement(const ReturnStatementSyntax* node) override
    {
        terminal(node->returnKeyword(), node);
        nonterminal(node->expression());
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }